

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

Matrix<Rational> __thiscall Matrix<Rational>::operator/(Matrix<Rational> *this,Rational *a)

{
  Matrix<Rational> *a_00;
  Rational *in_RDX;
  Rational *extraout_RDX;
  Matrix<Rational> MVar1;
  Matrix<Rational> temp;
  Matrix<Rational> local_60;
  Rational local_50;
  
  Matrix(&local_60,(Matrix<Rational> *)a);
  Rational::Rational(&local_50,in_RDX);
  a_00 = operator/=(&local_60,&local_50);
  Matrix(this,a_00);
  Rational::~Rational(&local_50);
  ~Matrix(&local_60);
  MVar1.arr = extraout_RDX;
  MVar1._0_8_ = this;
  return MVar1;
}

Assistant:

inline const Matrix operator/(Field a) const
    {
        Matrix temp(*this);
        return temp /= a;
    }